

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

bool __thiscall Board::suited_capabilities_met(Board *this)

{
  bool bVar1;
  reference ppVar2;
  mapped_type *ppvVar3;
  vector<Card,_std::allocator<Card>_> local_70;
  undefined1 local_58 [8];
  Hand hand;
  SuitPlayCapability capability;
  int player_number;
  pair<const_int,_SuitPlayCapability> *pair;
  iterator __end1;
  iterator __begin1;
  map<int,_SuitPlayCapability,_std::less<int>,_std::allocator<std::pair<const_int,_SuitPlayCapability>_>_>
  *__range1;
  Board *this_local;
  
  __end1 = std::
           map<int,_SuitPlayCapability,_std::less<int>,_std::allocator<std::pair<const_int,_SuitPlayCapability>_>_>
           ::begin(&this->m_player_suited_capabilities);
  pair = (pair<const_int,_SuitPlayCapability> *)
         std::
         map<int,_SuitPlayCapability,_std::less<int>,_std::allocator<std::pair<const_int,_SuitPlayCapability>_>_>
         ::end(&this->m_player_suited_capabilities);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&pair), bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_SuitPlayCapability>_>::operator*(&__end1);
    hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = ppVar2->first;
    hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = ppVar2->second;
    ppvVar3 = std::
              map<int,_std::vector<Card,_std::allocator<Card>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
              ::operator[](&this->m_player_hands,
                           (key_type *)
                           ((long)&hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + 4));
    std::vector<Card,_std::allocator<Card>_>::vector
              ((vector<Card,_std::allocator<Card>_> *)local_58,*ppvVar3);
    std::vector<Card,_std::allocator<Card>_>::vector
              (&local_70,(vector<Card,_std::allocator<Card>_> *)local_58);
    bVar1 = SuitPlayCapability::are_capabilities_broken
                      ((SuitPlayCapability *)
                       &hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&local_70);
    std::vector<Card,_std::allocator<Card>_>::~vector(&local_70);
    if (bVar1) {
      this_local._7_1_ = 0;
    }
    std::vector<Card,_std::allocator<Card>_>::~vector
              ((vector<Card,_std::allocator<Card>_> *)local_58);
    if (bVar1) goto LAB_00105ff9;
    std::_Rb_tree_iterator<std::pair<const_int,_SuitPlayCapability>_>::operator++(&__end1);
  }
  this_local._7_1_ = 1;
LAB_00105ff9:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Board::suited_capabilities_met()
{
    for(auto const &pair : m_player_suited_capabilities) {
        int player_number = pair.first;
        SuitPlayCapability capability = pair.second;
        Hand hand = *m_player_hands[player_number];
        if(capability.are_capabilities_broken(hand)) {
            return false;
        }
    }
    return true;
}